

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_status_t
linear_hash_insert(ion_key_t key,ion_value_t value,int hash_bucket_idx,
                  linear_hash_table_t *linear_hash)

{
  long lVar1;
  long lVar2;
  ion_value_t __src;
  byte bVar3;
  size_t __n;
  long record_loc;
  size_t __n_00;
  long bucket_loc;
  ion_fpos_t *overflow_loc;
  ion_byte_t *key_00;
  ulong uVar4;
  ion_byte_t *value_00;
  ion_byte_t aiStack_70 [8];
  ion_fpos_t iStack_68;
  ion_byte_t aiStack_60 [16];
  ion_value_t local_50;
  undefined1 local_48 [8];
  linear_hash_bucket_t bucket;
  ion_byte_t record_status;
  
  local_50 = value;
  if (hash_bucket_idx < linear_hash->next_split) {
    aiStack_60[0] = 0xca;
    aiStack_60[1] = 'O';
    aiStack_60[2] = '\x11';
    aiStack_60[3] = '\0';
    aiStack_60[4] = '\0';
    aiStack_60[5] = '\0';
    aiStack_60[6] = '\0';
    aiStack_60[7] = '\0';
    hash_bucket_idx = hash_to_bucket((ion_byte_t *)key,linear_hash);
  }
  __n = (size_t)(linear_hash->super).record.key_size;
  lVar2 = 8 - (__n + 0xf & 0xfffffffffffffff0);
  key_00 = aiStack_60 + lVar2;
  __n_00 = (size_t)(linear_hash->super).record.value_size;
  lVar1 = -(__n_00 + 0xf & 0xfffffffffffffff0);
  value_00 = key_00 + lVar1;
  bucket.overflow_location._7_1_ = 1;
  builtin_memcpy(aiStack_60 + lVar1 + lVar2 + -8,"\aP\x11",4);
  value_00[-4] = '\0';
  value_00[-3] = '\0';
  value_00[-2] = '\0';
  value_00[-1] = '\0';
  memcpy(key_00,key,__n);
  __src = local_50;
  builtin_memcpy(aiStack_60 + lVar1 + lVar2 + -8,"\x16P\x11",4);
  value_00[-4] = '\0';
  value_00[-3] = '\0';
  value_00[-2] = '\0';
  value_00[-1] = '\0';
  memcpy(value_00,__src,__n_00);
  bucket_loc = -1;
  if (hash_bucket_idx < linear_hash->bucket_map->current_size) {
    bucket_loc = linear_hash->bucket_map->data[hash_bucket_idx];
  }
  builtin_memcpy(aiStack_60 + lVar1 + lVar2 + -8,"@P\x11",4);
  value_00[-4] = '\0';
  value_00[-3] = '\0';
  value_00[-2] = '\0';
  value_00[-1] = '\0';
  bVar3 = linear_hash_get_bucket(bucket_loc,(linear_hash_bucket_t *)local_48,linear_hash);
  if (bVar3 == 0) {
    record_loc = bucket_loc + 0x10;
    overflow_loc = (ion_fpos_t *)value_00;
    if ((long)(int)local_48._4_4_ != 0) {
      if (linear_hash->records_per_bucket == local_48._4_4_) {
        overflow_loc = (ion_fpos_t *)(value_00 + -0x10);
        builtin_memcpy(aiStack_60 + lVar1 + lVar2 + -0x18,"rP\x11",4);
        value_00[-0x14] = '\0';
        value_00[-0x13] = '\0';
        value_00[-0x12] = '\0';
        value_00[-0x11] = '\0';
        bVar3 = create_overflow_bucket(local_48._0_4_,overflow_loc,linear_hash);
        if (bVar3 != 0) goto LAB_001150b0;
        local_48._4_4_ = 0;
        bucket.idx = (int)bucket_loc;
        bucket.record_count = (int)((ulong)bucket_loc >> 0x20);
        bucket_loc = *overflow_loc;
        record_loc = bucket_loc + 0x10;
      }
      else {
        record_loc = record_loc + (long)(int)local_48._4_4_ * linear_hash->record_total_size;
      }
    }
    overflow_loc[-1] = 0x1150ac;
    bVar3 = linear_hash_write_record
                      (record_loc,key_00,value_00,
                       (ion_byte_t *)((long)&bucket.overflow_location + 7),linear_hash);
    if (bVar3 == 0) {
      uVar4 = 0x100000000;
      local_48._4_4_ = local_48._4_4_ + 1;
      overflow_loc[-1] = 0x1150e4;
      bVar3 = linear_hash_update_bucket(bucket_loc,(linear_hash_bucket_t *)local_48,linear_hash);
      if (bVar3 == 0) {
        overflow_loc[-1] = 0x1150f0;
        linear_hash_increment_num_records(linear_hash);
        bVar3 = 0;
      }
      goto LAB_001150b3;
    }
  }
LAB_001150b0:
  uVar4 = 0;
LAB_001150b3:
  return (ion_status_t)(bVar3 | uVar4);
}

Assistant:

ion_status_t
linear_hash_insert(
	ion_key_t			key,
	ion_value_t			value,
	int					hash_bucket_idx,
	linear_hash_table_t *linear_hash
) {
	ion_status_t status = ION_STATUS_INITIALIZE;

	if (hash_bucket_idx < linear_hash->next_split) {
		hash_bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_full;

	memcpy(record_key, key, linear_hash->super.record.key_size);
	memcpy(record_value, value, linear_hash->super.record.value_size);

	/* get the appropriate bucket for insertion */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(hash_bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* location of the records in the bucket to be stored in */
	ion_fpos_t	bucket_records_loc = GET_BUCKET_RECORDS_LOC(bucket_loc);
	ion_fpos_t	record_loc;

	/* Case the bucket is empty */
	if (bucket.record_count == 0) {
		record_loc = bucket_records_loc;
	}
	else {
		/* Case that the bucket is full but there is not yet an overflow bucket */
		if (linear_hash_bucket_is_full(bucket, linear_hash)) {
			/* Get location of overflow bucket and update the tail record for the linked list of buckets storing
			 * items that hash to this bucket and update the tail bucket with the overflow's location */
			ion_fpos_t *overflow_location = alloca(sizeof(ion_fpos_t));

			status.error = create_overflow_bucket(bucket.idx, overflow_location, linear_hash);

			if (err_ok != status.error) {
				return status;
			}

			/* update parameters of bucket to match that of overflow just created */
			bucket.record_count			= 0;
			bucket.overflow_location	= bucket_loc;

			/* update the locations to write to in the file for the record and bucket */
			record_loc					= GET_BUCKET_RECORDS_LOC(*overflow_location);
			bucket_loc					= *overflow_location;
		}
		/* case there is >= 1 record in the bucket but it is not full */
		else {
			/* create a linear_hash_record with the desired key, value, and status of full*/
			record_loc = bucket_loc + sizeof(linear_hash_bucket_t) + bucket.record_count * linear_hash->record_total_size;
		}
	}

	/* write new record to the db */
	status.error = linear_hash_write_record(record_loc, record_key, record_value, &record_status, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	status.count++;

	/* update bucket */
	bucket.record_count++;
	status.error = linear_hash_update_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	status.error = err_ok;
	linear_hash_increment_num_records(linear_hash);
	return status;
}